

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcemodel.cpp
# Opt level: O3

int __thiscall FSSResourceModel::rowCount(FSSResourceModel *this,QModelIndex *parent)

{
  QAbstractItemModel *pQVar1;
  uint uVar2;
  QModelIndex p;
  int local_28;
  int local_24;
  long local_18;
  
  pQVar1 = parent->m;
  uVar2 = 0x21;
  if (pQVar1 != (QAbstractItemModel *)0x0 && -1 < (parent->c | parent->r)) {
    (**(code **)(*(long *)pQVar1 + 0x68))(&local_28,pQVar1,parent);
    if (((local_28 < 0) || (local_24 < 0)) || (uVar2 = 0, local_18 == 0)) {
      uVar2 = Data::get_resource_count(parent->r + AssetArtLandscape);
    }
  }
  return uVar2;
}

Assistant:

int
FSSResourceModel::rowCount(const QModelIndex &parent) const {
  if (!parent.isValid()) {
    return static_cast<int>(Data::AssetCursor);
  }

  QModelIndex p = parent.parent();
  if (!p.isValid()) {
    return Data::get_resource_count((Data::Resource)(parent.row() + 1));
  }

  return 0;
}